

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall
cmFileLockPool::LockFileScope(cmFileLockPool *this,string *filename,unsigned_long timeoutSec)

{
  bool bVar1;
  reference ppSVar2;
  unsigned_long timeoutSec_local;
  string *filename_local;
  cmFileLockPool *this_local;
  
  bVar1 = IsAlreadyLocked(this,filename);
  if (bVar1) {
    this_local = (cmFileLockPool *)cmFileLockResult::MakeAlreadyLocked();
  }
  else {
    bVar1 = std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
            empty(&this->FileScopes);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!this->FileScopes.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileLockPool.cxx"
                    ,0x3f,
                    "cmFileLockResult cmFileLockPool::LockFileScope(const std::string &, unsigned long)"
                   );
    }
    ppSVar2 = std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
              ::back(&this->FileScopes);
    this_local = (cmFileLockPool *)ScopePool::Lock(*ppSVar2,filename,timeoutSec);
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLockPool::LockFileScope(const std::string& filename,
                                               unsigned long timeoutSec)
{
  if (this->IsAlreadyLocked(filename)) {
    return cmFileLockResult::MakeAlreadyLocked();
  }
  assert(!this->FileScopes.empty());
  return this->FileScopes.back()->Lock(filename, timeoutSec);
}